

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O0

int32_t __thiscall
icu_63::UnicodeString::moveIndex32(UnicodeString *this,int32_t index,int32_t delta)

{
  int32_t iVar1;
  char16_t *pcVar2;
  int iVar3;
  bool bVar4;
  int local_30;
  int local_2c;
  int32_t __N_1;
  int32_t __N;
  UChar *array;
  int32_t len;
  int32_t delta_local;
  int32_t index_local;
  UnicodeString *this_local;
  
  iVar1 = length(this);
  if (index < 0) {
    len = 0;
  }
  else {
    len = index;
    if (iVar1 < index) {
      len = iVar1;
    }
  }
  pcVar2 = getArrayStart(this);
  local_2c = delta;
  if (delta < 1) {
    for (local_30 = -delta; 0 < local_30 && 0 < len; local_30 = local_30 + -1) {
      iVar3 = len + -1;
      if ((((pcVar2[iVar3] & 0xfc00U) == 0xdc00) && (0 < iVar3)) &&
         ((pcVar2[len + -2] & 0xfc00U) == 0xd800)) {
        iVar3 = len + -2;
      }
      len = iVar3;
    }
  }
  else {
    while( true ) {
      bVar4 = false;
      if (((0 < local_2c) && (bVar4 = true, iVar1 <= len)) && (bVar4 = false, iVar1 < 0)) {
        bVar4 = pcVar2[len] != L'\0';
      }
      if (!bVar4) break;
      iVar3 = len + 1;
      if ((((pcVar2[len] & 0xfc00U) == 0xd800) && (iVar3 != iVar1)) &&
         ((pcVar2[iVar3] & 0xfc00U) == 0xdc00)) {
        iVar3 = len + 2;
      }
      len = iVar3;
      local_2c = local_2c + -1;
    }
  }
  return len;
}

Assistant:

int32_t
UnicodeString::moveIndex32(int32_t index, int32_t delta) const {
  // pin index
  int32_t len = length();
  if(index<0) {
    index=0;
  } else if(index>len) {
    index=len;
  }

  const UChar *array = getArrayStart();
  if(delta>0) {
    U16_FWD_N(array, index, len, delta);
  } else {
    U16_BACK_N(array, 0, index, -delta);
  }

  return index;
}